

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

int pzshape::TPZShapeQuad::NConnectShapeF(int side,int order)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  int in_EDI;
  int local_4;
  
  if (in_EDI < 4) {
    local_4 = 1;
  }
  else if (in_EDI < 8) {
    local_4 = in_ESI + -1;
  }
  else if (in_EDI == 8) {
    local_4 = (in_ESI + -1) * (in_ESI + -1);
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"TPZShapeQuad::NConnectShapeF, bad parameter side "
                          );
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZShapeQuad::NConnectShapeF(int side, int order) {
		if(side<4) return 1;//0 a 4
		//   int s = side-4;//s = 0 a 14 ou side = 6 a 20
#ifdef PZDEBUG
        {
//            if(order <1) DebugStop();
        }
#endif
		if(side<8) return (order-1);//6 a 14
		if(side==8) {
			return ((order-1)*(order-1));
		}
		PZError << "TPZShapeQuad::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}